

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O1

int __thiscall ncnn::Pooling1D::forward(Pooling1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  ulong uVar22;
  int k;
  ulong uVar23;
  float fVar24;
  Mat bottom_blob_bordered;
  ulong local_a8;
  void *local_90;
  Mat local_88;
  long local_40;
  long local_38;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar14 = (ulong)uVar3;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      make_padding(this,bottom_blob,&local_88,opt);
      iVar10 = local_88.h;
      iVar4 = local_88.w;
      iVar13 = -100;
      if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        uVar14 = (ulong)(uint)local_88.h;
        iVar9 = (local_88.w - this->kernel_w) / this->stride_w;
        uVar19 = (ulong)(iVar9 + 1U);
        Mat::create(top_blob,iVar9 + 1U,local_88.h,sVar5,opt->blob_allocator);
        pvVar6 = top_blob->data;
        if ((pvVar6 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          iVar13 = 0;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar13 = 0;
              iVar12 = 0;
              if (this->pad_mode == 0) {
                iVar12 = (bottom_blob->w - local_88.w) + this->pad_left + this->pad_right;
              }
              if (0 < iVar10) {
                local_90 = local_88.data;
                local_40 = (long)top_blob->w * top_blob->elemsize;
                iVar10 = this->stride_w;
                uVar2 = this->kernel_w;
                local_38 = (long)local_88.w *
                           CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
                local_a8 = 0;
                do {
                  if (-1 < iVar9) {
                    iVar13 = this->pad_left;
                    lVar18 = 0;
                    uVar20 = 0;
                    pvVar17 = local_90;
                    do {
                      fVar24 = NAN;
                      if (0 < (int)uVar2) {
                        fVar24 = 0.0;
                        uVar22 = 0;
                        iVar11 = 0;
                        do {
                          iVar16 = 0x31;
                          if (((long)iVar13 <= (long)(lVar18 + uVar22)) &&
                             (iVar16 = 0x2f,
                             (long)(lVar18 + uVar22) < (long)((iVar12 + iVar4) - this->pad_right)))
                          {
                            fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar22 * 4);
                            iVar11 = iVar11 + 1;
                            iVar16 = 0;
                          }
                        } while (((iVar16 == 0x31) || (iVar16 == 0)) &&
                                (uVar22 = uVar22 + 1, uVar2 != uVar22));
                        fVar24 = fVar24 / (float)iVar11;
                      }
                      *(float *)((long)pvVar6 + uVar20 * 4 + local_40 * local_a8) = fVar24;
                      uVar20 = uVar20 + 1;
                      pvVar17 = (void *)((long)pvVar17 + (long)iVar10 * 4);
                      lVar18 = lVar18 + iVar10;
                    } while (uVar20 != uVar19);
                  }
                  local_a8 = local_a8 + 1;
                  local_90 = (void *)((long)local_90 + local_38);
                  iVar13 = 0;
                } while (local_a8 != uVar14);
              }
            }
            else if (0 < iVar10) {
              iVar4 = top_blob->w;
              sVar5 = top_blob->elemsize;
              uVar2 = this->kernel_w;
              iVar10 = this->stride_w;
              uVar20 = 0;
              iVar13 = 0;
              pvVar17 = local_88.data;
              do {
                if (-1 < iVar9) {
                  uVar22 = 0;
                  pvVar21 = pvVar17;
                  do {
                    fVar24 = 0.0;
                    if (0 < (int)uVar2) {
                      uVar23 = 0;
                      do {
                        fVar24 = fVar24 + *(float *)((long)pvVar21 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar2 != uVar23);
                    }
                    *(float *)((long)pvVar6 + uVar22 * 4 + (long)iVar4 * sVar5 * uVar20) =
                         fVar24 * (1.0 / (float)(int)uVar2);
                    uVar22 = uVar22 + 1;
                    pvVar21 = (void *)((long)pvVar21 + (long)iVar10 * 4);
                  } while (uVar22 != uVar19);
                }
                uVar20 = uVar20 + 1;
                pvVar17 = (void *)((long)pvVar17 +
                                  (long)local_88.w *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
              } while (uVar20 != uVar14);
            }
          }
          else {
            iVar13 = 0;
            if ((this->pooling_type == 0) && (0 < iVar10)) {
              lVar18 = (long)local_88.w *
                       CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
              iVar4 = top_blob->w;
              sVar5 = top_blob->elemsize;
              iVar10 = this->stride_w;
              uVar2 = this->kernel_w;
              uVar20 = 0;
              pvVar17 = local_88.data;
              do {
                if (-1 < iVar9) {
                  uVar22 = 0;
                  pvVar21 = pvVar17;
                  do {
                    fVar24 = *(float *)((long)local_88.data +
                                       uVar22 * (long)iVar10 * 4 + lVar18 * uVar20);
                    if (0 < (int)uVar2) {
                      uVar23 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar21 + uVar23 * 4);
                        if (fVar24 <= fVar1) {
                          fVar24 = fVar1;
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar2 != uVar23);
                    }
                    *(float *)((long)pvVar6 + uVar22 * 4 + (long)iVar4 * sVar5 * uVar20) = fVar24;
                    uVar22 = uVar22 + 1;
                    pvVar21 = (void *)((long)pvVar21 + (long)iVar10 * 4);
                  } while (uVar22 != uVar19);
                }
                uVar20 = uVar20 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar18);
              } while (uVar20 != uVar14);
              iVar13 = 0;
            }
          }
        }
      }
      piVar8 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,uVar3,sVar5,opt->blob_allocator);
      pvVar6 = top_blob->data;
      iVar13 = -100;
      if ((pvVar6 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar13 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar3) {
            lVar18 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar17 = bottom_blob->data;
            iVar4 = top_blob->w;
            sVar5 = top_blob->elemsize;
            uVar3 = this->out_w;
            uVar19 = 0;
            pvVar21 = pvVar17;
            do {
              if (0 < (int)uVar3) {
                uVar20 = 0;
                do {
                  iVar13 = (int)((int)uVar20 * uVar2) / (int)uVar3;
                  uVar22 = uVar20 + 1;
                  iVar10 = (int)((int)uVar22 * uVar2 + (uVar3 - 1)) / (int)uVar3;
                  lVar15 = (long)iVar13;
                  fVar24 = *(float *)((long)pvVar17 + lVar15 * 4 + lVar18 * uVar19);
                  if (iVar13 < iVar10) {
                    do {
                      fVar1 = *(float *)((long)pvVar21 + lVar15 * 4);
                      if (fVar24 <= fVar1) {
                        fVar24 = fVar1;
                      }
                      lVar15 = lVar15 + 1;
                    } while (iVar10 != lVar15);
                  }
                  *(float *)((long)pvVar6 + uVar20 * 4 + (long)iVar4 * sVar5 * uVar19) = fVar24;
                  uVar20 = uVar22;
                } while (uVar22 != uVar3);
              }
              uVar19 = uVar19 + 1;
              pvVar21 = (void *)((long)pvVar21 + lVar18);
              iVar13 = 0;
            } while (uVar19 != uVar14);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar3)) {
          pvVar17 = bottom_blob->data;
          iVar4 = bottom_blob->w;
          iVar10 = top_blob->w;
          sVar5 = top_blob->elemsize;
          uVar3 = this->out_w;
          sVar7 = bottom_blob->elemsize;
          uVar19 = 0;
          iVar13 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar20 = 0;
              do {
                iVar12 = (int)((int)uVar20 * uVar2) / (int)uVar3;
                uVar22 = uVar20 + 1;
                iVar9 = (int)((int)uVar22 * uVar2 + (uVar3 - 1)) / (int)uVar3;
                fVar24 = 0.0;
                if (iVar9 - iVar12 != 0 && iVar12 <= iVar9) {
                  lVar18 = (long)iVar12;
                  do {
                    fVar24 = fVar24 + *(float *)((long)pvVar17 + lVar18 * 4);
                    lVar18 = lVar18 + 1;
                  } while (iVar9 != lVar18);
                }
                *(float *)((long)pvVar6 + uVar20 * 4 + (long)iVar10 * sVar5 * uVar19) =
                     fVar24 / (float)(iVar9 - iVar12);
                uVar20 = uVar22;
              } while (uVar22 != uVar3);
            }
            uVar19 = uVar19 + 1;
            pvVar17 = (void *)((long)pvVar17 + (long)iVar4 * sVar7);
          } while (uVar19 != uVar14);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar5,opt->blob_allocator);
    pvVar6 = top_blob->data;
    iVar13 = -100;
    if ((pvVar6 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (this->pooling_type == 0) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar17 = bottom_blob->data;
        lVar18 = (long)bottom_blob->w * bottom_blob->elemsize;
        uVar19 = 0;
        pvVar21 = pvVar17;
        do {
          fVar24 = *(float *)((long)pvVar17 + lVar18 * uVar19);
          if (0 < (int)uVar2) {
            uVar20 = 0;
            do {
              fVar1 = *(float *)((long)pvVar21 + uVar20 * 4);
              if (fVar24 <= fVar1) {
                fVar24 = fVar1;
              }
              uVar20 = uVar20 + 1;
            } while (uVar2 != uVar20);
          }
          *(float *)((long)pvVar6 + uVar19 * 4) = fVar24;
          uVar19 = uVar19 + 1;
          pvVar21 = (void *)((long)pvVar21 + lVar18);
        } while (uVar19 != uVar14);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar3 < 1) {
          return 0;
        }
        iVar4 = bottom_blob->w;
        sVar5 = bottom_blob->elemsize;
        pvVar17 = bottom_blob->data;
        uVar19 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar2) {
            uVar20 = 0;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar2 != uVar20);
          }
          *(float *)((long)pvVar6 + uVar19 * 4) = fVar24 * (1.0 / (float)(int)uVar2);
          uVar19 = uVar19 + 1;
          pvVar17 = (void *)((long)pvVar17 + (long)iVar4 * sVar5);
        } while (uVar19 != uVar14);
      }
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int Pooling1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling1D     input %d x %d  pad = %d %d  ksize=%d  stride=%d", w, h, pad_left, pad_right, kernel_w, stride_w);
    if (global_pooling)
    {
        top_blob.create(h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float max = ptr[0];
                for (int i = 0; i < w; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float sum = 0.f;
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / w;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                    float max = inptr[iw0];
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        max = std::max(max, inptr[iw]);
                    }

                    outptr[j] = max;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                    const int wk = iw1 - iw0;

                    float sum = 0;
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        sum += inptr[iw];
                    }

                    outptr[j] = sum / wk;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;

    top_blob.create(outw, h, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < h; q++)
        {
            const float* ptr = bottom_blob_bordered.row(q);
            float* outptr = top_blob.row(q);

            for (int j = 0; j < outw; j++)
            {
                const float* sptr = ptr + j * stride_w;

                float max = sptr[0];

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = sptr[k];
                    max = std::max(max, val);
                }

                outptr[j] = max;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    int sx0 = j * stride_w;

                    float sum = 0;
                    int area = 0;

                    for (int kj = 0; kj < kernel_w; kj++)
                    {
                        int sx = sx0 + kj;

                        if (sx < pad_left)
                            continue;

                        if (sx >= w - pad_right - wtailpad)
                            break;

                        float val = ptr[sx];
                        sum += val;
                        area += 1;
                    }

                    outptr[j] = sum / area;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = ptr + j * stride_w;

                    float sum = 0;

                    for (int k = 0; k < kernel_w; k++)
                    {
                        float val = sptr[k];
                        sum += val;
                    }

                    outptr[j] = sum / kernel_w;
                }
            }
        }
    }

    return 0;
}